

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

int __thiscall
CVmObjBigNum::calc_sinhcosh
          (CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *retval,uint *argc,int is_cosh,int is_tanh)

{
  int iVar1;
  undefined4 in_ESI;
  uint *in_RDI;
  vm_obj_id_t unaff_retaddr;
  CVmObjBigNum *in_stack_00000008;
  char *new_ext;
  int in_stack_00000108;
  int in_stack_0000010c;
  char *in_stack_00000110;
  char *in_stack_00000118;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = setup_getp_0(in_stack_00000008,unaff_retaddr,
                       (vm_val_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       in_RDI,(char **)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
  if (iVar1 == 0) {
    compute_sinhcosh_into(in_stack_00000118,in_stack_00000110,in_stack_0000010c,in_stack_00000108);
    CVmStack::discard();
  }
  return 1;
}

Assistant:

int CVmObjBigNum::calc_sinhcosh(VMG_ vm_obj_id_t self,
                                vm_val_t *retval, uint *argc,
                                int is_cosh, int is_tanh)
{
    char *new_ext;

    /* check arguments and allocate the return value */
    if (setup_getp_0(vmg_ self, retval, argc, &new_ext))
        return TRUE;

    /* calculate the result */
    compute_sinhcosh_into(new_ext, ext_, is_cosh, is_tanh);

    /* discard the GC protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}